

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLSetTargetStringAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,char *ptr
              )

{
  int iVar1;
  int iVar2;
  XExtDisplayInfo *pXVar3;
  size_t sVar4;
  int success;
  int size;
  xnvCtrlSetStringAttributeReply rep;
  xnvCtrlSetStringAttributeReq *req;
  XExtDisplayInfo *info;
  char *ptr_local;
  uint attribute_local;
  uint display_mask_local;
  int target_id_local;
  int target_type_local;
  Display *dpy_local;
  
  pXVar3 = find_display(dpy);
  if ((pXVar3 == (XExtDisplayInfo *)0x0) || (pXVar3->codes == (XExtCodes *)0x0)) {
    dpy_local._4_4_ = 0;
  }
  else if ((pXVar3 == (XExtDisplayInfo *)0x0) || (pXVar3->codes == (XExtCodes *)0x0)) {
    XMissingExtension(dpy,nvctrl_extension_name);
    dpy_local._4_4_ = 0;
  }
  else {
    sVar4 = strlen(ptr);
    iVar2 = (int)sVar4;
    iVar1 = iVar2 + 1;
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->lock_display)(dpy);
    }
    rep._24_8_ = _XGetRequest(dpy,9,0x14);
    *(char *)rep._24_8_ = (char)pXVar3->codes->major_opcode;
    *(undefined1 *)(rep._24_8_ + 1) = 9;
    *(short *)(rep._24_8_ + 6) = (short)target_type;
    *(short *)(rep._24_8_ + 4) = (short)target_id;
    *(uint *)(rep._24_8_ + 8) = display_mask;
    *(uint *)(rep._24_8_ + 0xc) = attribute;
    *(short *)(rep._24_8_ + 2) = *(short *)(rep._24_8_ + 2) + (short)(iVar2 + 4 >> 2);
    *(int *)(rep._24_8_ + 0x10) = iVar1;
    if (dpy->bufmax < dpy->bufptr + iVar1) {
      _XSend(dpy,ptr,(long)iVar1);
    }
    else {
      memcpy(dpy->bufptr,ptr,(long)iVar1);
      dpy->bufptr = dpy->bufptr + (int)(iVar2 + 4U & 0xfffffffc);
    }
    iVar2 = _XReply(dpy,&success,0);
    if (iVar2 == 0) {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
      dpy_local._4_4_ = 0;
    }
    else {
      if (dpy->lock_fns != (_XLockPtrs *)0x0) {
        (*dpy->lock_fns->unlock_display)(dpy);
      }
      if (dpy->synchandler != (_func_int__XDisplay_ptr *)0x0) {
        (*dpy->synchandler)(dpy);
      }
      dpy_local._4_1_ = rep.type;
      dpy_local._5_1_ = rep.pad0;
      dpy_local._6_2_ = rep.sequenceNumber;
    }
  }
  return dpy_local._4_4_;
}

Assistant:

Bool XNVCTRLSetTargetStringAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char *ptr
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlSetStringAttributeReq *req;
    xnvCtrlSetStringAttributeReply rep;
    int size;
    Bool success;
    
    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);

    size = strlen(ptr)+1;

    LockDisplay (dpy);
    GetReq (nvCtrlSetStringAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlSetStringAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    req->length += ((size + 3) & ~3) >> 2;
    req->num_bytes = size;
    Data(dpy, ptr, size);
    
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    UnlockDisplay (dpy);
    SyncHandle ();
    
    success = rep.flags;
    return success;
}